

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

string * __thiscall
Jupiter::Socket::ntop_abi_cxx11_(string *__return_storage_ptr__,Socket *this,void *ip,size_t size)

{
  in6_addr ip_00;
  
  if (ip == (void *)0x10) {
    ip_00.__in6_u._8_8_ = size;
    ip_00.__in6_u._0_8_ = this->m_data;
    ntop6_abi_cxx11_(__return_storage_ptr__,(Socket *)this->_vptr_Socket,ip_00);
  }
  else if (ip == (void *)0x4) {
    ntop4_abi_cxx11_(__return_storage_ptr__,(Socket *)(ulong)*(uint *)&this->_vptr_Socket,4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::ntop(void *ip, size_t size) {
	switch (size) {
	case 4:
		return ntop4(*reinterpret_cast<uint32_t *>(ip));
	case 16:
		return ntop6(*reinterpret_cast<in_addr6 *>(ip));
	default:
		return {};
	}
}